

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdAddPubkeyHashSignByHandle
              (void *handle,void *create_handle,char *txid,uint32_t vout,int hash_type,char *pubkey,
              char *signature,bool use_der_encode,int sighash_type,bool sighash_anyone_can_pay)

{
  ConfidentialTransactionContext *this;
  bool bVar1;
  AddressType address_type;
  CfdException *pCVar2;
  TransactionContext *tx;
  bool is_bitcoin;
  allocator local_199;
  ByteData signature_bytes;
  SigHashType sighashtype;
  SignParameter param;
  SignParameter local_e8;
  SigHashType local_70;
  SigHashType local_64;
  OutPoint outpoint;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&param,"TransactionData",(allocator *)&local_e8);
  cfd::capi::CheckBuffer(create_handle,(string *)&param);
  std::__cxx11::string::~string((string *)&param);
  bVar1 = cfd::capi::IsEmptyString(txid);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x55a;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"txid is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. txid is null or empty.",(allocator *)&local_e8
              );
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(pubkey);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x560;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"pubkey is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. pubkey is null or empty.",
               (allocator *)&local_e8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (bVar1) {
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_transaction.cpp";
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x566;
    param.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdAddPubkeyHashSignByHandle";
    cfd::core::logger::warn<>((CfdSourceLocation *)&param,"signature is null or empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&param,"Failed to parameter. signature is null or empty.",
               (allocator *)&local_e8);
    cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&param);
    __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  if (*(long *)((long)create_handle + 0x18) != 0) {
    std::__cxx11::string::string((string *)&local_e8,txid,(allocator *)&signature_bytes);
    cfd::core::Txid::Txid((Txid *)&param,(string *)&local_e8);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&param,vout);
    cfd::core::Txid::~Txid((Txid *)&param);
    std::__cxx11::string::~string((string *)&local_e8);
    address_type = cfd::capi::ConvertHashToAddressType(hash_type);
    cfd::SignParameter::SignParameter(&param);
    if (use_der_encode) {
      cfd::core::SigHashType::Create
                (&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
      std::__cxx11::string::string((string *)&local_e8,signature,&local_199);
      cfd::core::ByteData::ByteData(&signature_bytes,(string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      cfd::core::SigHashType::SigHashType(&local_64,&sighashtype);
      cfd::SignParameter::SignParameter(&local_e8,&signature_bytes,true,&local_64);
      cfd::SignParameter::operator=(&param,&local_e8);
      cfd::SignParameter::~SignParameter(&local_e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_bytes);
    }
    else {
      std::__cxx11::string::string((string *)&signature_bytes,signature,(allocator *)&sighashtype);
      cfd::core::SigHashType::SigHashType(&local_70,kSigHashAll,false,false);
      cfd::SignParameter::SignParameter(&local_e8,(string *)&signature_bytes,false,&local_70);
      cfd::SignParameter::operator=(&param,&local_e8);
      cfd::SignParameter::~SignParameter(&local_e8);
      std::__cxx11::string::~string((string *)&signature_bytes);
    }
    this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
    if (is_bitcoin == true) {
      std::__cxx11::string::string((string *)&local_e8,pubkey,(allocator *)&sighashtype);
      cfd::core::Pubkey::Pubkey((Pubkey *)&signature_bytes,(string *)&local_e8);
      cfd::TransactionContext::AddPubkeyHashSign
                ((TransactionContext *)this,&outpoint,&param,(Pubkey *)&signature_bytes,address_type
                );
    }
    else {
      std::__cxx11::string::string((string *)&local_e8,pubkey,(allocator *)&sighashtype);
      cfd::core::Pubkey::Pubkey((Pubkey *)&signature_bytes,(string *)&local_e8);
      cfd::ConfidentialTransactionContext::AddPubkeyHashSign
                (this,&outpoint,&param,(Pubkey *)&signature_bytes,address_type);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature_bytes);
    std::__cxx11::string::~string((string *)&local_e8);
    cfd::SignParameter::~SignParameter(&param);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return 0;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&param,"Invalid handle state. tx is null",(allocator *)&local_e8);
  cfd::core::CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&param);
  __cxa_throw(pCVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddPubkeyHashSignByHandle(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    int hash_type, const char* pubkey, const char* signature,
    bool use_der_encode, int sighash_type, bool sighash_anyone_can_pay) {
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    }
    OutPoint outpoint(Txid(txid), vout);

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    SignParameter param;
    if (use_der_encode) {
      // encode to der
      SigHashType sighashtype = SigHashType::Create(
          static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
      ByteData signature_bytes = ByteData(std::string(signature));
      param = SignParameter(signature_bytes, true, sighashtype);
    } else {
      param = SignParameter(std::string(signature));
    }

    if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      tx->AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      tx->AddPubkeyHashSign(outpoint, param, Pubkey(pubkey), addr_type);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}